

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall QHttp2Connection::handlePING(QHttp2Connection *this)

{
  QHttp2Connection *this_00;
  QHttp2Connection *this_01;
  __optional_ne_t<QByteArrayView,_QByteArray> _Var1;
  quint32 qVar2;
  FrameFlags FVar3;
  int __fd;
  uchar *begin;
  uchar *puVar4;
  size_t __n;
  void *__buf;
  long in_FS_OFFSET;
  QByteArrayView local_50;
  undefined1 local_3c [20];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x238;
  qVar2 = Http2::Frame::streamID((Frame *)this_00);
  if (qVar2 == 0) {
    FVar3 = Http2::Frame::flags((Frame *)this_00);
    if (((uint)FVar3.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
               super_QFlagsStorage<Http2::FrameFlag>.i & 1) == 0) {
      local_3c._12_8_ = &local_50;
      local_50.m_size = local_50.m_size & 0xffffffff00000000;
      local_3c._4_8_ = 0;
      QMetaObject::activate((QObject *)this,&staticMetaObject,5,(void **)(local_3c + 4));
      this_01 = this + 0x250;
      __n = 0;
      Http2::FrameWriter::start((FrameWriter *)this_01,PING,(FrameFlags)0x1,0);
      begin = Http2::Frame::dataBegin((Frame *)this_00);
      puVar4 = Http2::Frame::dataBegin((Frame *)this_00);
      Http2::FrameWriter::append((FrameWriter *)this_01,begin,puVar4 + 8);
      __fd = QMetaObject::cast((QObject *)&QIODevice::staticMetaObject);
      Http2::FrameWriter::write((FrameWriter *)this_01,__fd,__buf,__n);
    }
    else {
      local_50.m_data = (storage_type *)Http2::Frame::dataBegin((Frame *)this_00);
      local_50.m_size = 8;
      if (this[0x208] == (QHttp2Connection)0x0) {
        local_3c._12_8_ = local_3c;
        local_3c._0_4_ = 3;
        local_3c._4_8_ = 0;
        QMetaObject::activate((QObject *)this,&staticMetaObject,5,(void **)(local_3c + 4));
        qHttp2ConnectionLog();
        if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledWarning._q_value._M_base._M_i
            & 1) != 0) {
          handlePING(this);
        }
      }
      else {
        _Var1 = std::operator!=(&local_50,(optional<QByteArray> *)(this + 0x1f0));
        if (_Var1) {
          local_3c._12_8_ = local_3c;
          local_3c._0_4_ = 2;
          local_3c._4_8_ = 0;
          QMetaObject::activate((QObject *)this,&staticMetaObject,5,(void **)(local_3c + 4));
          qHttp2ConnectionLog();
          if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledWarning._q_value._M_base.
                     _M_i & 1) != 0) {
            handlePING(this);
          }
        }
        else {
          local_3c._12_8_ = local_3c;
          local_3c._0_4_ = 1;
          local_3c._4_8_ = 0;
          QMetaObject::activate((QObject *)this,&staticMetaObject,5,(void **)(local_3c + 4));
        }
      }
      if (this[0x208] == (QHttp2Connection)0x1) {
        std::_Optional_payload_base<QByteArray>::_M_destroy
                  ((_Optional_payload_base<QByteArray> *)(this + 0x1f0));
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    connectionError(this,PROTOCOL_ERROR,"PING on invalid stream");
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handlePING()
{
    Q_ASSERT(inboundFrame.type() == FrameType::PING);

    // RFC 9113, 6.7: PING frames are not associated with any individual stream. If a PING frame is
    // received with a Stream Identifier field value other than 0x00, the recipient MUST respond
    // with a connection error
    if (inboundFrame.streamID() != connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "PING on invalid stream");

    // Receipt of a PING frame with a length field value other than 8 MUST be treated
    // as a connection error (Section 5.4.1) of type FRAME_SIZE_ERROR.
    // checked in Frame::validateHeader()
    Q_ASSERT(inboundFrame.payloadSize() == 8);

    if (inboundFrame.flags() & FrameFlag::ACK) {
        QByteArrayView pingSignature(reinterpret_cast<const char *>(inboundFrame.dataBegin()), 8);
        if (!m_lastPingSignature.has_value()) {
            emit pingFrameRecived(PingState::PongNoPingSent);
            qCWarning(qHttp2ConnectionLog, "[%p] PING with ACK received but no PING was sent.", this);
        } else if (pingSignature != m_lastPingSignature) {
            emit pingFrameRecived(PingState::PongSignatureChanged);
            qCWarning(qHttp2ConnectionLog, "[%p] PING signature does not match the last PING.", this);
        } else {
            emit pingFrameRecived(PingState::PongSignatureIdentical);
        }
        m_lastPingSignature.reset();
        return;
    } else {
        emit pingFrameRecived(PingState::Ping);

    }


    frameWriter.start(FrameType::PING, FrameFlag::ACK, connectionStreamID);
    frameWriter.append(inboundFrame.dataBegin(), inboundFrame.dataBegin() + 8);
    frameWriter.write(*getSocket());
}